

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void CheckName(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  Bool BVar1;
  Node *pNVar2;
  Node *old;
  AttVal *attval_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  if ((attval == (AttVal *)0x0) || (attval->value == (tmbstr)0x0)) {
    prvTidyReportAttrError(doc,node,attval,0x256);
  }
  else {
    BVar1 = prvTidyIsAnchorElement(doc,node);
    if (BVar1 != no) {
      if (((int)(doc->config).value[100].v != 0) &&
         (BVar1 = IsValidNMTOKEN(attval->value), BVar1 == no)) {
        prvTidyReportAttrError(doc,node,attval,0x22b);
      }
      pNVar2 = GetNodeByAnchor(doc,attval->value);
      if ((pNVar2 == (Node *)0x0) || (pNVar2 == node)) {
        AddAnchor(doc,attval->value,node);
      }
      else if (node->implicit == no) {
        prvTidyReportAttrError(doc,node,attval,0x223);
      }
      else {
        prvTidyReportAttrError(doc,node,attval,0x224);
      }
    }
  }
  return;
}

Assistant:

void CheckName( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    Node *old;

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    if ( TY_(IsAnchorElement)(doc, node) )
    {
        if (cfgBool(doc, TidyXmlOut) && !IsValidNMTOKEN(attval->value))
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);

        if ((old = GetNodeByAnchor(doc, attval->value)) &&  old != node)
        {
            if (node->implicit) /* Is #709 - improve warning text */
                TY_(ReportAttrError)(doc, node, attval, ANCHOR_DUPLICATED);
            else
                TY_(ReportAttrError)( doc, node, attval, ANCHOR_NOT_UNIQUE);
        }
        else
            AddAnchor( doc, attval->value, node );
    }
}